

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O2

bool __thiscall setup::info::check_key(info *this,string *key)

{
  checksum *other;
  uint uVar1;
  checksum_type type;
  EVP_PKEY_CTX *ctx;
  runtime_error *this_00;
  bool bVar2;
  char buffer [4];
  char nonce [24];
  xchacha20 cipher;
  
  other = &(this->header).password;
  type = (this->header).password.type;
  if (type == PBKDF2_SHA256_XChaCha20) {
    if (key->_M_string_length != 0x38) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"unexpected key size");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    ctx = (EVP_PKEY_CTX *)(key->_M_dataplus)._M_p;
    nonce._0_8_ = *(undefined8 *)(ctx + 0x20);
    nonce._16_8_ = *(undefined8 *)(ctx + 0x30);
    nonce._8_4_ = (undefined4)*(undefined8 *)(ctx + 0x28);
    uVar1 = ~nonce._8_4_;
    nonce._12_4_ = (undefined4)((ulong)*(undefined8 *)(ctx + 0x28) >> 0x20);
    nonce[8] = (char)uVar1;
    nonce[9] = (char)(uVar1 >> 8);
    nonce[10] = (char)(uVar1 >> 0x10);
    nonce[0xb] = (char)(uVar1 >> 0x18);
    crypto::xchacha20::init(&cipher,ctx);
    buffer[0] = '\0';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    crypto::xchacha20::crypt(&cipher,buffer,buffer);
    bVar2 = buffer == (char  [4])(other->field_0).adler32;
  }
  else {
    crypto::hasher::hasher((hasher *)&cipher,type);
    crypto::hasher::update
              ((hasher *)&cipher,(this->header).password_salt._M_dataplus._M_p,
               (this->header).password_salt._M_string_length);
    crypto::hasher::update((hasher *)&cipher,(key->_M_dataplus)._M_p,key->_M_string_length);
    crypto::hasher::finalize((checksum *)nonce,(hasher *)&cipher);
    bVar2 = crypto::checksum::operator==((checksum *)nonce,other);
  }
  return bVar2;
}

Assistant:

bool info::check_key(const std::string & key) {
	
	if(header.password.type == crypto::PBKDF2_SHA256_XChaCha20) {
		
		#if INNOEXTRACT_HAVE_DECRYPTION
		
		if(key.length() != crypto::xchacha20::key_size + crypto::xchacha20::nonce_size) {
			throw std::runtime_error("unexpected key size");
		}
		
		crypto::xchacha20 cipher;
		
		char nonce[crypto::xchacha20::nonce_size];
		std::memcpy(nonce, key.c_str() + crypto::xchacha20::key_size, crypto::xchacha20::nonce_size);
		*reinterpret_cast<boost::uint32_t *>(nonce + 8) = ~*reinterpret_cast<boost::uint32_t *>(nonce + 8);
		cipher.init(key.c_str(), nonce);
		
		char buffer[] = { 0, 0, 0, 0 };
		cipher.crypt(buffer, buffer, sizeof(buffer));
		
		return (std::memcmp(buffer, header.password.check, sizeof(buffer)) == 0);
		
		#else
		throw std::runtime_error("XChaCha20 decryption not supported in this build");
		#endif
		
	} else {
		
		crypto::hasher checksum(header.password.type);
		checksum.update(header.password_salt.c_str(), header.password_salt.length());
		checksum.update(key.c_str(), key.length());
		return (checksum.finalize() == header.password);
		
	}
	
}